

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall wabt::anon_unknown_0::CWriter::RestoreSegueBase(CWriter *this)

{
  int iVar1;
  Newline *extraout_RDX;
  Newline *extraout_RDX_00;
  Newline *u;
  Newline *u_00;
  char *t;
  CWriter *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_38._8_8_ = 0;
  pcStack_20 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2556:15)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2556:15)>
             ::_M_manager;
  iVar1 = this->indent_;
  this->indent_ = 0;
  local_38._M_unused._M_object = this;
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2556:15)>
  ::_M_invoke(&local_38);
  this->indent_ = iVar1;
  u = extraout_RDX;
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,3);
    u = extraout_RDX_00;
  }
  t = "wasm_rt_segue_write_base(segue_saved_base);";
  (anonymous_namespace)::CWriter::Write<char_const(&)[44],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [44])"wasm_rt_segue_write_base(segue_saved_base);",u);
  uStack_50 = 0;
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2562:15)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:2562:15)>
             ::_M_manager;
  iVar1 = this->indent_;
  this->indent_ = 0;
  local_58 = this;
  (anonymous_namespace)::CWriter::Write<char_const(&)[7],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,(char (*) [7])t,u_00);
  this->indent_ = iVar1;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  return;
}

Assistant:

void CWriter::RestoreSegueBase() {
  NonIndented([&] {
    Write(
        "#if WASM_RT_USE_SEGUE_FOR_THIS_MODULE && !WASM_RT_SEGUE_FREE_SEGMENT",
        Newline());
  });
  Write("wasm_rt_segue_write_base(segue_saved_base);", Newline());
  NonIndented([&] { Write("#endif", Newline()); });
}